

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_test.cpp
# Opt level: O3

void __thiscall QuadDrawer::render(QuadDrawer *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  glBindTexture(0xde1,texture);
  glBegin(7);
  glColor3f(0x3f800000,0x3f800000,0);
  dVar1 = (this->a).x;
  dVar2 = (this->a).y;
  dVar3 = (this->a).z;
  dVar4 = (this->b).x;
  dVar5 = (this->b).y;
  dVar6 = (this->b).z;
  dVar7 = (this->c).x;
  dVar8 = (this->c).y;
  dVar9 = (this->c).z;
  dVar10 = (this->d).x;
  dVar11 = (this->d).y;
  dVar12 = (this->d).z;
  glTexCoord2f(0,0);
  glVertex3f((float)dVar1,(float)dVar2,(float)dVar3);
  glTexCoord2f(0,0x3f800000);
  glVertex3f((float)dVar4,(float)dVar5,(float)dVar6);
  glTexCoord2f(0x3f800000,0x3f800000);
  glVertex3f((float)dVar7,(float)dVar8,(float)dVar9);
  glTexCoord2f(0x3f800000,0);
  glVertex3f((float)dVar10,(float)dVar11,(float)dVar12);
  glDeleteTextures(1,&texture);
  glDisable(0xde1);
  glEnd();
  return;
}

Assistant:

void render() {
    glBindTexture(GL_TEXTURE_2D, texture); // Comment this out to disable textures
    glBegin(GL_QUADS);

    glColor3f( 1.0, 1.0, 0.0); // Can play with RGB values here :)

    Vector3D a_trans = mult(mat, a);
    Vector3D b_trans = mult(mat, b);
    Vector3D c_trans = mult(mat, c);
    Vector3D d_trans = mult(mat, d);
      
    glTexCoord2f(0,0);
    glVertex3f(a_trans[0], a_trans[1], a_trans[2]);
    /* TODO: change the (0,1) below to (0,.1) to zoom into the texture to see changes. */
    glTexCoord2f(0,1);
    glVertex3f(b_trans[0], b_trans[1], b_trans[2]);
    /* TODO: change the (1,1) below to (.1,.1) to zoom into the texture to see changes. */
    glTexCoord2f(1,1);
    glVertex3f(c_trans[0], c_trans[1], c_trans[2]);
    /* TODO: change the (1,0) to (.1,0) to zoom into the texture to see changes. */
    glTexCoord2f(1,0);
    glVertex3f(d_trans[0], d_trans[1], d_trans[2]);
    glDeleteTextures(1, &texture);
    glDisable(GL_TEXTURE_2D);
    glEnd();
  }